

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O2

void updateOutInIndex(HighsIndexCollection *index_collection,HighsInt *out_from_ix,
                     HighsInt *out_to_ix,HighsInt *in_from_ix,HighsInt *in_to_ix,
                     HighsInt *current_set_entry)

{
  HighsInt HVar1;
  pointer piVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  HighsIndexCollection *pHVar7;
  long lVar8;
  ulong uVar9;
  
  if (index_collection->is_interval_ == true) {
    *out_from_ix = index_collection->from_;
    iVar4 = index_collection->to_;
    *out_to_ix = iVar4;
    *in_from_ix = iVar4 + 1;
    iVar4 = index_collection->dimension_;
  }
  else {
    if (index_collection->is_set_ != true) {
      *out_from_ix = *in_to_ix + 1;
      uVar5 = index_collection->dimension_;
      *out_to_ix = uVar5 - 1;
      uVar6 = (ulong)*in_to_ix;
      uVar9 = uVar6;
      do {
        uVar9 = uVar9 + 1;
        if ((long)index_collection->dimension_ <= (long)uVar9) goto LAB_003642a3;
        iVar4 = (int)uVar6;
        uVar3 = iVar4 + 1;
        uVar6 = (ulong)uVar3;
      } while ((index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9] != 0);
      *out_to_ix = iVar4;
      uVar5 = uVar3;
LAB_003642a3:
      *in_from_ix = uVar5;
      *in_to_ix = index_collection->dimension_ + -1;
      lVar8 = (long)*out_to_ix;
      iVar4 = *out_to_ix + -1;
      do {
        lVar8 = lVar8 + 1;
        if (index_collection->dimension_ <= lVar8) {
          return;
        }
        iVar4 = iVar4 + 1;
      } while ((index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8] == 0);
      goto LAB_0036429c;
    }
    piVar2 = (index_collection->set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    HVar1 = piVar2[*current_set_entry];
    *out_from_ix = HVar1;
    *out_to_ix = HVar1;
    iVar4 = *current_set_entry + 1;
    *current_set_entry = iVar4;
    for (lVar8 = (long)iVar4;
        (lVar8 < index_collection->set_num_entries_ && (piVar2[lVar8] <= *out_to_ix + 1));
        lVar8 = lVar8 + 1) {
      *out_to_ix = piVar2[iVar4];
      iVar4 = *current_set_entry + 1;
      *current_set_entry = iVar4;
    }
    *in_from_ix = *out_to_ix + 1;
    pHVar7 = (HighsIndexCollection *)(piVar2 + *current_set_entry);
    if (index_collection->set_num_entries_ <= *current_set_entry) {
      pHVar7 = index_collection;
    }
    iVar4 = pHVar7->dimension_;
  }
  iVar4 = iVar4 + -1;
LAB_0036429c:
  *in_to_ix = iVar4;
  return;
}

Assistant:

void updateOutInIndex(const HighsIndexCollection& index_collection,
                      HighsInt& out_from_ix, HighsInt& out_to_ix,
                      HighsInt& in_from_ix, HighsInt& in_to_ix,
                      HighsInt& current_set_entry) {
  if (index_collection.is_interval_) {
    out_from_ix = index_collection.from_;
    out_to_ix = index_collection.to_;
    in_from_ix = index_collection.to_ + 1;
    in_to_ix = index_collection.dimension_ - 1;
  } else if (index_collection.is_set_) {
    out_from_ix = index_collection.set_[current_set_entry];
    out_to_ix = out_from_ix;
    current_set_entry++;
    HighsInt current_set_entry0 = current_set_entry;
    for (HighsInt set_entry = current_set_entry0;
         set_entry < index_collection.set_num_entries_; set_entry++) {
      HighsInt ix = index_collection.set_[set_entry];
      if (ix > out_to_ix + 1) break;
      out_to_ix = index_collection.set_[current_set_entry];
      current_set_entry++;
    }
    in_from_ix = out_to_ix + 1;
    if (current_set_entry < index_collection.set_num_entries_) {
      in_to_ix = index_collection.set_[current_set_entry] - 1;
    } else {
      // Account for getting to the end of the set
      in_to_ix = index_collection.dimension_ - 1;
    }
  } else {
    out_from_ix = in_to_ix + 1;
    out_to_ix = index_collection.dimension_ - 1;
    for (HighsInt ix = in_to_ix + 1; ix < index_collection.dimension_; ix++) {
      if (!index_collection.mask_[ix]) {
        out_to_ix = ix - 1;
        break;
      }
    }
    in_from_ix = out_to_ix + 1;
    in_to_ix = index_collection.dimension_ - 1;
    for (HighsInt ix = out_to_ix + 1; ix < index_collection.dimension_; ix++) {
      if (index_collection.mask_[ix]) {
        in_to_ix = ix - 1;
        break;
      }
    }
  }
}